

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SkipList.cpp
# Opt level: O2

void __thiscall SkipList::put(SkipList *this,uint64_t key,string *value)

{
  size_type sVar1;
  bool bVar2;
  Node **ppNVar3;
  _Elt_pointer ppNVar4;
  Node *pNVar5;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar6;
  Node *pNVar7;
  Node *local_d8;
  SkipList *local_d0;
  Node **local_c8;
  char *local_c0;
  size_type local_b8;
  char local_b0;
  undefined7 uStack_af;
  undefined8 uStack_a8;
  char *local_a0;
  size_type local_98;
  char local_90;
  undefined7 uStack_8f;
  undefined8 uStack_88;
  stack<SkipList::Node_*,_std::deque<SkipList::Node_*,_std::allocator<SkipList::Node_*>_>_> path;
  
  std::stack<SkipList::Node*,std::deque<SkipList::Node*,std::allocator<SkipList::Node*>>>::
  stack<std::deque<SkipList::Node*,std::allocator<SkipList::Node*>>,void>(&path);
  ppNVar3 = &this->head;
  local_d0 = this;
  while (local_d8 = *ppNVar3, pNVar7 = local_d8, local_d8 != (Node *)0x0) {
    do {
      local_d8 = pNVar7;
      pNVar7 = local_d8->right;
      if (pNVar7 == (Node *)0x0) goto LAB_00107349;
    } while (pNVar7->key < key);
    if (pNVar7->key == key) {
      local_d0->valueSize =
           (local_d0->valueSize - (pNVar7->value)._M_string_length) + value->_M_string_length;
      for (; pNVar7 != (Node *)0x0; pNVar7 = pNVar7->down) {
        std::__cxx11::string::_M_assign((string *)&pNVar7->value);
      }
      goto LAB_0010756b;
    }
LAB_00107349:
    std::deque<SkipList::Node_*,_std::allocator<SkipList::Node_*>_>::push_back(&path.c,&local_d8);
    ppNVar3 = &local_d8->down;
  }
  bVar2 = true;
  pNVar7 = (Node *)0x0;
  local_c8 = &this->head;
  do {
    ppNVar3 = local_c8;
    if (bVar2 == false) {
LAB_00107541:
      sVar1 = value->_M_string_length;
      local_d0->length = local_d0->length + 1;
      local_d0->valueSize = sVar1 + local_d0->valueSize;
LAB_0010756b:
      std::_Deque_base<SkipList::Node_*,_std::allocator<SkipList::Node_*>_>::~_Deque_base
                ((_Deque_base<SkipList::Node_*,_std::allocator<SkipList::Node_*>_> *)&path);
      return;
    }
    if (path.c.super__Deque_base<SkipList::Node_*,_std::allocator<SkipList::Node_*>_>._M_impl.
        super__Deque_impl_data._M_finish._M_cur ==
        path.c.super__Deque_base<SkipList::Node_*,_std::allocator<SkipList::Node_*>_>._M_impl.
        super__Deque_impl_data._M_start._M_cur) {
      local_d8 = *local_c8;
      pNVar5 = (Node *)operator_new(0x38);
      pNVar5->right = (Node *)0x0;
      pNVar5->down = (Node *)0x0;
      pNVar5->key = 0;
      (pNVar5->value)._M_dataplus._M_p = (pointer)&(pNVar5->value).field_2;
      (pNVar5->value)._M_string_length = 0;
      (pNVar5->value).field_2._M_local_buf[0] = '\0';
      *ppNVar3 = pNVar5;
      pNVar5 = (Node *)operator_new(0x38);
      std::__cxx11::string::string((string *)&local_a0,(string *)value);
      sVar1 = local_98;
      pNVar5->right = (Node *)0x0;
      pNVar5->down = pNVar7;
      pNVar5->key = key;
      paVar6 = &(pNVar5->value).field_2;
      (pNVar5->value)._M_dataplus._M_p = (pointer)paVar6;
      if (local_a0 == &local_90) {
        paVar6->_M_allocated_capacity = CONCAT71(uStack_8f,local_90);
        *(undefined8 *)((long)&(pNVar5->value).field_2 + 8) = uStack_88;
      }
      else {
        (pNVar5->value)._M_dataplus._M_p = local_a0;
        (pNVar5->value).field_2._M_allocated_capacity = CONCAT71(uStack_8f,local_90);
      }
      local_98 = 0;
      (pNVar5->value)._M_string_length = sVar1;
      local_90 = '\0';
      (*ppNVar3)->right = pNVar5;
      local_a0 = &local_90;
      std::__cxx11::string::~string((string *)&local_a0);
      (*ppNVar3)->down = local_d8;
      goto LAB_00107541;
    }
    ppNVar4 = path.c.super__Deque_base<SkipList::Node_*,_std::allocator<SkipList::Node_*>_>._M_impl.
              super__Deque_impl_data._M_finish._M_cur;
    if (path.c.super__Deque_base<SkipList::Node_*,_std::allocator<SkipList::Node_*>_>._M_impl.
        super__Deque_impl_data._M_finish._M_cur ==
        path.c.super__Deque_base<SkipList::Node_*,_std::allocator<SkipList::Node_*>_>._M_impl.
        super__Deque_impl_data._M_finish._M_first) {
      ppNVar4 = path.c.super__Deque_base<SkipList::Node_*,_std::allocator<SkipList::Node_*>_>.
                _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
    }
    local_d8 = ppNVar4[-1];
    std::deque<SkipList::Node_*,_std::allocator<SkipList::Node_*>_>::pop_back(&path.c);
    pNVar5 = (Node *)operator_new(0x38);
    std::__cxx11::string::string((string *)&local_c0,(string *)value);
    sVar1 = local_b8;
    pNVar5->right = local_d8->right;
    pNVar5->down = pNVar7;
    pNVar5->key = key;
    paVar6 = &(pNVar5->value).field_2;
    (pNVar5->value)._M_dataplus._M_p = (pointer)paVar6;
    if (local_c0 == &local_b0) {
      paVar6->_M_allocated_capacity = CONCAT71(uStack_af,local_b0);
      *(undefined8 *)((long)&(pNVar5->value).field_2 + 8) = uStack_a8;
    }
    else {
      (pNVar5->value)._M_dataplus._M_p = local_c0;
      (pNVar5->value).field_2._M_allocated_capacity = CONCAT71(uStack_af,local_b0);
    }
    local_b8 = 0;
    (pNVar5->value)._M_string_length = sVar1;
    local_b0 = '\0';
    local_d8->right = pNVar5;
    local_c0 = &local_b0;
    std::__cxx11::string::~string((string *)&local_c0);
    pNVar7 = local_d8->right;
    bVar2 = shouldGrowUp(local_d0);
  } while( true );
}

Assistant:

void SkipList::put(uint64_t key, const string &value) {
  // if key exists, update the value of all nodes
  static auto update = [](Node *p, const string &value) {
    while (p) {
      p->value = value;
      p = p->down;
    }
  };

  // find the place to insert
  stack<Node *> path;
  Node *p = head;
  while (p) {
    while (p->right && p->right->key < key) p = p->right;
    // if key exists
    if (p->right && p->right->key == key) {
      valueSize -= p->right->value.size();
      valueSize += value.size();
      update(p->right, value);
      return;
    }
    path.push(p);
    p = p->down;
  }

  // insert and grow up
  bool grow = true;
  Node *down = nullptr;
  while (grow && !path.empty()) {
    p = path.top();
    path.pop();
    p->right = new Node(key, value, p->right, down);
    down = p->right;
    grow = shouldGrowUp();
  }

  // height + 1
  if (grow) {
    p = head;
    head = new Node;
    head->right = new Node(key, value, nullptr, down);
    head->down = p;
  }

  length++;
  valueSize += value.size();
}